

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall
sysapi::epoll_registration::epoll_registration
          (epoll_registration *this,epoll *ep,int fd,uint32_t events,callback_t *callback)

{
  this->ep = ep;
  this->fd = fd;
  this->events = events;
  std::function<void_(unsigned_int)>::function(&this->callback,callback);
  epoll::add(ep,fd,events,this);
  return;
}

Assistant:

epoll_registration::epoll_registration(epoll& ep, int fd, uint32_t events, callback_t callback)
    : ep(&ep)
    , fd(fd)
    , events(events)
    , callback(std::move(callback))
{
    ep.add(fd, events, this);
}